

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O3

string_view __thiscall absl::ByLength::Find(ByLength *this,string_view text,size_t pos)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  uVar2 = text._M_len;
  if (uVar2 < pos) {
    pos = uVar2;
  }
  if ((ulong)this->length_ < uVar2 - pos) {
    uVar2 = this->length_ + pos;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = text._M_str + uVar2;
  return (string_view)(auVar1 << 0x40);
}

Assistant:

absl::string_view ByLength::Find(absl::string_view text, size_t pos) const {
  pos = std::min(pos, text.size());  // truncate `pos`
  absl::string_view substr = text.substr(pos);
  // If the string is shorter than the chunk size we say we
  // "can't find the delimiter" so this will be the last chunk.
  if (substr.length() <= static_cast<size_t>(length_))
    return absl::string_view(text.data() + text.size(), 0);

  return absl::string_view(substr.data() + length_, 0);
}